

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

path * make_tmp_file(path *__return_storage_ptr__,path *in_filename,string *in_data)

{
  ofstream file;
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  std::filesystem::temp_directory_path_abi_cxx11_();
  std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,in_filename);
  std::filesystem::remove(__return_storage_ptr__);
  std::ofstream::ofstream
            (&local_218,(__return_storage_ptr__->_M_pathname)._M_dataplus._M_p,_S_out|_S_bin);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,(in_data->_M_dataplus)._M_p,in_data->_M_string_length);
  std::ostream::flush();
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path make_tmp_file(std::filesystem::path in_filename, const std::string& in_data) {
	// Build path
	std::filesystem::path path = std::filesystem::temp_directory_path();
	path /= in_filename;

	// Delete any previously existing file
	std::filesystem::remove(path);

	// Populate file
	{
		std::ofstream file{ path, std::ios::binary | std::ios::out };
		file << in_data << std::flush;
	}

	// Return fstream to file
	return path;
	//return std::fstream{ path, std::ios::binary | std::ios::out | std::ios::in };
}